

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

Expression * __thiscall slang::ast::PortConnection::getExpression(PortConnection *this)

{
  Compilation *this_00;
  Type *arg;
  bool bVar1;
  ArgumentDirection direction;
  Expression *pEVar2;
  Type *type;
  Diagnostic *this_01;
  bitmask<slang::ast::AssignFlags> flags;
  Type *argType;
  ulong uVar3;
  PortSymbol *pPVar4;
  ulong uVar5;
  LookupLocation LVar6;
  pair<slang::ast::ArgumentDirection,_const_slang::ast::Type_*> pVar7;
  SourceRange sourceRange;
  SourceRange assignmentRange;
  SourceRange assignmentRange_00;
  undefined1 in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff81;
  Expression *e;
  InstanceSymbolBase *local_70;
  ASTContext context;
  
  if (this->expr != (Expression *)0x0) {
    return this->expr;
  }
  pPVar4 = (PortSymbol *)this->port;
  if ((pPVar4->super_Symbol).kind == InterfacePort) {
LAB_0021149b:
    pEVar2 = (Expression *)0x0;
  }
  else {
    if ((this->field_4).exprSyntax == (ExpressionSyntax *)0x0 &&
        this->connectedSymbol == (Symbol *)0x0) {
      if (this->useDefault != true) goto LAB_0021149b;
      pEVar2 = PortSymbol::getInitializer(pPVar4);
    }
    else {
      local_70 = (InstanceSymbolBase *)
                 ((pPVar4->super_Symbol).parentScope)->thisSym[1].originatingSyntax;
      LVar6 = LookupLocation::after((Symbol *)local_70);
      pPVar4 = (PortSymbol *)this->port;
      if ((pPVar4->super_Symbol).kind == Port) {
        bVar1 = PortSymbol::isNetPort(pPVar4);
        uVar5 = (ulong)((uint)bVar1 << 0x1f) | 0x20;
        pPVar4 = (PortSymbol *)this->port;
      }
      else {
        uVar5 = 0x20;
      }
      pVar7 = getDirAndType(&pPVar4->super_Symbol);
      argType = pVar7.second;
      direction = pVar7.first;
      uVar3 = 0;
      if (direction - Out < 2) {
        uVar3 = (ulong)(direction == InOut) << 0x26 | 0x100000;
      }
      context.flags.m_bits =
           (ulong)(*(byte *)(*(long *)&local_70[1].super_Symbol + 0x88) & 2) << 0x2b | uVar3 | uVar5
      ;
      context.instanceOrProc = (Symbol *)0x0;
      context.firstTempVar = (TempVarSymbol *)0x0;
      context.randomizeDetails = (RandomizeDetails *)0x0;
      context.assertionInstance = (AssertionInstanceDetails *)0x0;
      context.scope.ptr = LVar6.scope;
      context.lookupIndex = LVar6.index;
      ASTContext::setInstance(&context,local_70);
      if (this->connectedSymbol != (Symbol *)0x0) {
        sourceRange.endLoc = (SourceLocation)0x0;
        sourceRange.startLoc = (this->field_4).implicitNameRange.endLoc;
        e = ValueExpressionBase::fromSymbol
                      ((ValueExpressionBase *)&context,(ASTContext *)this->connectedSymbol,
                       (Symbol *)0x0,(HierarchicalReference *)(this->field_4).exprSyntax,sourceRange
                       ,false,(bool)in_stack_ffffffffffffff80);
        flags.m_bits = (direction == Out) << 3;
        bVar1 = Type::isEquivalent((e->type).ptr,argType);
        if (!bVar1) {
          this_00 = (context.scope.ptr)->compilation;
          arg = (e->type).ptr;
          if (direction != Ref) {
            if (direction == In) {
              assignmentRange.endLoc = (SourceLocation)0x0;
              assignmentRange.startLoc = (this->field_4).implicitNameRange.endLoc;
              e = Expression::convertAssignment
                            ((Expression *)&context,(ASTContext *)argType,(Type *)e,
                             (Expression *)(this->field_4).exprSyntax,assignmentRange,
                             (Expression **)0x0,
                             (bitmask<slang::ast::AssignFlags> *)
                             CONCAT17(flags.m_bits,
                                      CONCAT61(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80))
                            );
            }
            else {
              type = (Type *)BumpAllocator::
                             emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange_const&>
                                       (&this_00->super_BumpAllocator,argType,
                                        &(this->field_4).implicitNameRange);
              assignmentRange_00.endLoc = (SourceLocation)&e;
              assignmentRange_00.startLoc = (this->field_4).implicitNameRange.endLoc;
              Expression::convertAssignment
                        ((Expression *)&context,(ASTContext *)(e->type).ptr,type,
                         (Expression *)(this->field_4).exprSyntax,assignmentRange_00,
                         (Expression **)&stack0xffffffffffffff87,
                         (bitmask<slang::ast::AssignFlags> *)
                         CONCAT17(flags.m_bits,
                                  CONCAT61(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80)));
            }
          }
          if (((direction == Ref || (local_70->arrayPath)._M_extent._M_extent_value == 0) &&
              (bVar1 = Expression::bad(e), !bVar1)) && (bVar1 = Type::isError(argType), !bVar1)) {
            this_01 = ASTContext::addDiag(&context,(DiagCode)0xf00006,
                                          (this->field_4).implicitNameRange);
            Diagnostic::operator<<(this_01,this->port->name);
            ast::operator<<(this_01,argType);
            ast::operator<<(this_01,arg);
            if (direction == Ref) {
              e = &BumpAllocator::
                   emplace<slang::ast::InvalidExpression,slang::ast::Expression*&,slang::ast::Type_const&>
                             (&this_00->super_BumpAllocator,&e,this_00->errorType)->super_Expression
              ;
            }
          }
        }
        this->expr = e;
        bVar1 = Expression::bad(e);
        if (!bVar1) {
          Expression::checkConnectionDirection
                    (this->expr,direction,&context,(this->expr->sourceRange).startLoc,flags);
        }
        return this->expr;
      }
      pEVar2 = Expression::bindArgument
                         (argType,direction,(bitmask<slang::ast::VariableFlags>)0x0,
                          (this->field_4).exprSyntax,&context);
    }
    this->expr = pEVar2;
  }
  return pEVar2;
}

Assistant:

const Expression* PortConnection::getExpression() const {
    if (expr || port.kind == SymbolKind::InterfacePort)
        return expr;

    if (connectedSymbol || exprSyntax) {
        auto& parentInstance = getParentInstance();
        auto ll = LookupLocation::after(parentInstance);
        auto scope = ll.getScope();
        SLANG_ASSERT(scope);

        const bool isNetPort = port.kind == SymbolKind::Port && port.as<PortSymbol>().isNetPort();
        auto [direction, type] = getDirAndType(port);

        bitmask<ASTFlags> flags = ASTFlags::NonProcedural;
        if (isNetPort)
            flags |= ASTFlags::AllowInterconnect;

        if (direction == ArgumentDirection::Out || direction == ArgumentDirection::InOut) {
            flags |= ASTFlags::LValue;
            if (direction == ArgumentDirection::InOut)
                flags |= ASTFlags::LAndRValue;
        }

        if (parentInstance.body.flags.has(InstanceFlags::FromBind))
            flags |= ASTFlags::BindInstantiation;

        ASTContext context(*scope, ll, flags);
        context.setInstance(parentInstance);

        if (connectedSymbol) {
            Expression* e = &ValueExpressionBase::fromSymbol(context, *connectedSymbol, nullptr,
                                                             implicitNameRange);

            bitmask<AssignFlags> assignFlags;
            if (direction == ArgumentDirection::Out)
                assignFlags = AssignFlags::OutputPort;

            if (!e->type->isEquivalent(*type)) {
                auto& comp = context.getCompilation();
                auto exprType = e->type;
                if (direction == ArgumentDirection::In) {
                    e = &Expression::convertAssignment(context, *type, *e, implicitNameRange);
                }
                else if (direction != ArgumentDirection::Ref) {
                    auto rhs = comp.emplace<EmptyArgumentExpression>(*type, implicitNameRange);
                    Expression::convertAssignment(context, *e->type, *rhs, implicitNameRange, &e,
                                                  &assignFlags);
                }

                // We should warn for this case unless convertAssignment already issued an error,
                // or if we're in an instance array unwrapping case.
                if ((parentInstance.arrayPath.empty() || direction == ArgumentDirection::Ref) &&
                    !e->bad() && !type->isError()) {
                    auto& diag = context.addDiag(diag::ImplicitNamedPortTypeMismatch,
                                                 implicitNameRange);
                    diag << port.name;
                    diag << *type;
                    diag << *exprType;

                    // There's no way to represent this expression for the ref case.
                    if (direction == ArgumentDirection::Ref)
                        e = comp.emplace<InvalidExpression>(e, comp.getErrorType());
                }
            }

            expr = e;
            if (!expr->bad()) {
                Expression::checkConnectionDirection(*expr, direction, context,
                                                     expr->sourceRange.start(), assignFlags);
            }
        }
        else {
            expr = &Expression::bindArgument(*type, direction, {}, *exprSyntax, context);
        }
    }
    else if (useDefault) {
        auto& ps = port.as<PortSymbol>();
        expr = ps.getInitializer();
    }

    return expr;
}